

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

int test_loop(char *rom_filename,int num_log_lines,char *log_filename,uint32_t test_failed_address,
             int watch_reg)

{
  size_t sVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t *puVar6;
  uint32_t uVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  int *piVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long alStack_60 [3];
  long local_48;
  uint32_t local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  
  uVar3 = (ulong)(uint)num_log_lines;
  gba_log_verbosity = 4;
  alStack_60[2] = 0x102695;
  local_40 = test_failed_address;
  local_38 = watch_reg;
  init_gbasystem(rom_filename,(char *)0x0,false);
  alStack_60[2] = 0x1026a4;
  skip_bios(cpu);
  alStack_60[uVar3 * -10 + 2] = 0x1026c0;
  load_log(log_filename,num_log_lines,(cpu_log_t *)((long)&stack0xffffffffffffffb8 + uVar3 * -0x50))
  ;
  if (1 < gba_log_verbosity) {
    sVar1 = mem->rom_size;
    alStack_60[uVar3 * -10 + 2] = 0x1026e2;
    printf("\x1b[0;36m[INFO]  ROM loaded: %lu bytes\n\x1b[0;m",sVar1);
    if (1 < gba_log_verbosity) {
      alStack_60[uVar3 * -10 + 2] = 0x1026fc;
      printf("\x1b[0;36m[INFO]  Beginning CPU loop\n\x1b[0;m");
    }
  }
  lVar22 = (long)num_log_lines;
  piVar19 = (int *)(&stack0x00000004 + uVar3 * -0x50);
  uVar20 = 0;
  iVar5 = 0;
  local_48 = lVar22;
  do {
    uVar7 = cpu->pc;
    uVar4 = (cpu->cpsr).raw;
    uVar10 = uVar4 & 0x20;
    uVar21 = (uVar7 + (uVar10 >> 4)) - 4;
    if ((long)uVar20 < lVar22) {
      if (2 < gba_log_verbosity) {
        alStack_60[uVar3 * -10 + 2] = 0x102762;
        printf("[DEBUG] Checking registers against step %d (line %d in log)\n",uVar20 & 0xffffffff,
               (ulong)((int)uVar20 + 1));
        uVar7 = cpu->pc;
        uVar4 = (cpu->cpsr).raw;
        uVar10 = uVar4 & 0x20;
      }
      uVar13 = piVar19[-0x13];
      if (uVar13 != ((uint)(uVar10 != 0) * 2 | 0xfffffffc) + uVar7) {
        alStack_60[uVar3 * -10 + 2] = 0x5a;
        uVar2 = alStack_60[uVar3 * -10 + 2];
        alStack_60[uVar3 * -10 + 2] = 0x102c16;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,uVar2);
        uVar10 = (cpu->pc + (((cpu->cpsr).raw & 0x20) >> 4)) - 4;
        pcVar14 = 
        "ASSERTION FAILED: Address expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
        goto LAB_001030a2;
      }
      local_34 = uVar21;
      uVar10 = piVar19[-0x11];
      if (uVar10 != uVar4) {
        local_3c = iVar5;
        alStack_60[uVar3 * -10 + 2] = 0x1027bf;
        printf("Expected cpsr: ");
        pcVar14 = "N";
        if (-1 < (int)uVar10) {
          pcVar14 = "-";
        }
        pcVar11 = "Z";
        if ((uVar10 >> 0x1e & 1) == 0) {
          pcVar11 = "-";
        }
        pcVar9 = "C";
        if ((uVar10 >> 0x1d & 1) == 0) {
          pcVar9 = "-";
        }
        pcVar15 = "V";
        if ((uVar10 >> 0x1c & 1) == 0) {
          pcVar15 = "-";
        }
        pcVar16 = "I";
        if (-1 < (char)uVar10) {
          pcVar16 = "-";
        }
        pcVar17 = "F";
        if ((uVar10 & 0x40) == 0) {
          pcVar17 = "-";
        }
        pcVar18 = "T";
        if ((uVar10 & 0x20) == 0) {
          pcVar18 = "-";
        }
        alStack_60[uVar3 * -10 + 2] = (long)pcVar18;
        alStack_60[uVar3 * -10 + 1] = (long)pcVar17;
        alStack_60[uVar3 * -10] = 0x10283b;
        printf("[%s%s%s%s%s%s%s]",pcVar14,pcVar11,pcVar9,pcVar15,pcVar16);
        alStack_60[uVar3 * -10 + 2] = 0x10284b;
        printf(" Actual cpsr: ");
        lVar22 = local_48;
        uVar21 = (cpu->cpsr).raw;
        pcVar14 = "N";
        if (-1 < (int)uVar21) {
          pcVar14 = "-";
        }
        pcVar11 = "Z";
        if ((uVar21 >> 0x1e & 1) == 0) {
          pcVar11 = "-";
        }
        pcVar9 = "C";
        if ((uVar21 >> 0x1d & 1) == 0) {
          pcVar9 = "-";
        }
        pcVar15 = "V";
        if ((uVar21 >> 0x1c & 1) == 0) {
          pcVar15 = "-";
        }
        pcVar16 = "I";
        if (-1 < (char)uVar21) {
          pcVar16 = "-";
        }
        pcVar17 = "F";
        if ((uVar21 & 0x40) == 0) {
          pcVar17 = "-";
        }
        pcVar18 = "T";
        if ((uVar21 & 0x20) == 0) {
          pcVar18 = "-";
        }
        alStack_60[uVar3 * -10 + 2] = (long)pcVar18;
        alStack_60[uVar3 * -10 + 1] = (long)pcVar17;
        alStack_60[uVar3 * -10] = 0x1028d2;
        printf("[%s%s%s%s%s%s%s]",pcVar14,pcVar11,pcVar9,pcVar15,pcVar16);
        alStack_60[uVar3 * -10 + 2] = 10;
        uVar2 = alStack_60[uVar3 * -10 + 2];
        alStack_60[uVar3 * -10 + 2] = 0x1028dc;
        putchar((int)uVar2);
        uVar4 = (cpu->cpsr).raw;
        iVar5 = local_3c;
      }
      uVar13 = piVar19[-0x10];
      if (uVar13 == cpu->r[0]) {
        uVar13 = piVar19[-0xf];
        if (uVar13 == cpu->r[1]) {
          uVar13 = piVar19[-0xe];
          if (uVar13 == cpu->r[2]) {
            uVar13 = piVar19[-0xd];
            if (uVar13 == cpu->r[3]) {
              uVar13 = piVar19[-0xc];
              if (uVar13 == cpu->r[4]) {
                uVar13 = piVar19[-0xb];
                if (uVar13 == cpu->r[5]) {
                  uVar13 = piVar19[-10];
                  if (uVar13 == cpu->r[6]) {
                    uVar13 = piVar19[-9];
                    if (uVar13 == cpu->r[7]) {
                      uVar13 = piVar19[-8];
                      if ((uVar4 & 0x1f) == 0x11) {
                        if (uVar13 == cpu->highreg_fiq[0]) {
                          uVar13 = piVar19[-7];
                          if (uVar13 == cpu->highreg_fiq[1]) {
                            uVar13 = piVar19[-6];
                            if (uVar13 == cpu->highreg_fiq[2]) {
                              uVar13 = piVar19[-5];
                              alStack_60[uVar3 * -10 + 2] = 0x7c;
                              lVar12 = alStack_60[uVar3 * -10 + 2];
                              if (uVar13 != cpu->highreg_fiq[3]) goto LAB_00102e26;
LAB_001029f4:
                              uVar21 = local_34;
                              uVar13 = piVar19[-4];
                              if (uVar13 == *(uint *)((long)cpu->r + lVar12 + -0x38)) {
                                uVar8 = (uVar4 & 0x1f) - 0x11;
                                lVar12 = 0x80;
                                if (uVar8 < 0xb) {
                                  lVar12 = *(long *)(&DAT_0011e780 + (ulong)uVar8 * 8);
                                }
                                uVar13 = piVar19[-3];
                                if (uVar13 == *(uint *)((long)cpu->r + lVar12 + -0x38)) {
                                  lVar12 = 0x98;
                                  if (uVar8 < 0xb) {
                                    lVar12 = *(long *)(&DAT_0011e7d8 + (ulong)uVar8 * 8);
                                  }
                                  uVar13 = piVar19[-2];
                                  if (uVar13 == *(uint *)((long)cpu->r + lVar12 + -0x38)) {
                                    uVar13 = piVar19[-1];
                                    if (uVar13 == cpu->pc) {
                                      if (uVar10 == uVar4) {
                                        if ((iVar5 != *piVar19) && (gba_log_verbosity != 0)) {
                                          alStack_60[uVar3 * -10 + 2] = 0x102a90;
                                          printf("\x1b[0;33m[WARN]  Cycles incorrect!\n\x1b[0;m");
                                        }
                                        goto LAB_00102a9a;
                                      }
                                      alStack_60[uVar3 * -10 + 2] = 0x74;
                                      uVar2 = alStack_60[uVar3 * -10 + 2];
                                      alStack_60[uVar3 * -10 + 2] = 0x103042;
                                      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                              ,uVar2);
                                      uVar20 = (ulong)(cpu->cpsr).raw;
                                      pcVar14 = 
                                      "ASSERTION FAILED: CPSR expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                                      ;
                                      uVar13 = uVar10;
                                      uVar21 = local_34;
                                    }
                                    else {
                                      alStack_60[uVar3 * -10 + 2] = 0x73;
                                      uVar2 = alStack_60[uVar3 * -10 + 2];
                                      alStack_60[uVar3 * -10 + 2] = 0x103001;
                                      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                              ,uVar2);
                                      uVar20 = (ulong)cpu->pc;
                                      pcVar14 = 
                                      "ASSERTION FAILED: r15 (PC) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                                      ;
                                      uVar21 = local_34;
                                    }
                                  }
                                  else {
                                    alStack_60[uVar3 * -10 + 2] = 0x72;
                                    uVar2 = alStack_60[uVar3 * -10 + 2];
                                    alStack_60[uVar3 * -10 + 2] = 0x102ba1;
                                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                            ,uVar2);
                                    uVar21 = ((cpu->cpsr).raw & 0x1f) - 0x11;
                                    lVar22 = 0x98;
                                    if (uVar21 < 0xb) {
                                      lVar22 = *(long *)(&DAT_0011e7d8 + (ulong)uVar21 * 8);
                                    }
                                    uVar20 = (ulong)*(uint *)((long)cpu->r + lVar22 + -0x38);
                                    pcVar14 = 
                                    "ASSERTION FAILED: r14 (LR) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                                    ;
                                    uVar21 = local_34;
                                  }
                                }
                                else {
                                  alStack_60[uVar3 * -10 + 2] = 0x71;
                                  uVar2 = alStack_60[uVar3 * -10 + 2];
                                  alStack_60[uVar3 * -10 + 2] = 0x102b43;
                                  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                          ,uVar2);
                                  uVar21 = ((cpu->cpsr).raw & 0x1f) - 0x11;
                                  lVar22 = 0x80;
                                  if (uVar21 < 0xb) {
                                    lVar22 = *(long *)(&DAT_0011e780 + (ulong)uVar21 * 8);
                                  }
                                  uVar20 = (ulong)*(uint *)((long)cpu->r + lVar22 + -0x38);
                                  pcVar14 = 
                                  "ASSERTION FAILED: r13 (SP) expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                                  ;
                                  uVar21 = local_34;
                                }
                              }
                              else {
                                alStack_60[uVar3 * -10 + 2] = 0x70;
                                uVar2 = alStack_60[uVar3 * -10 + 2];
                                alStack_60[uVar3 * -10 + 2] = 0x102f19;
                                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                        ,uVar2);
                                puVar6 = cpu->highreg_fiq + 4;
                                if (((cpu->cpsr).raw & 0x1f) != 0x11) {
                                  puVar6 = cpu->r + 0xc;
                                }
                                uVar20 = (ulong)*puVar6;
                                pcVar14 = 
                                "ASSERTION FAILED: r12 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                                ;
                                uVar21 = local_34;
                              }
                            }
                            else {
LAB_00102d55:
                              alStack_60[uVar3 * -10 + 2] = 0x6e;
                              uVar2 = alStack_60[uVar3 * -10 + 2];
                              alStack_60[uVar3 * -10 + 2] = 0x102d77;
                              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                      ,uVar2);
                              puVar6 = cpu->highreg_fiq + 2;
                              if (((cpu->cpsr).raw & 0x1f) != 0x11) {
                                puVar6 = cpu->r + 10;
                              }
                              uVar20 = (ulong)*puVar6;
                              pcVar14 = 
                              "ASSERTION FAILED: r10 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                              ;
                              uVar21 = local_34;
                            }
                          }
                          else {
LAB_00102c84:
                            alStack_60[uVar3 * -10 + 2] = 0x6d;
                            uVar2 = alStack_60[uVar3 * -10 + 2];
                            alStack_60[uVar3 * -10 + 2] = 0x102ca6;
                            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                    ,uVar2);
                            puVar6 = cpu->highreg_fiq + 1;
                            if (((cpu->cpsr).raw & 0x1f) != 0x11) {
                              puVar6 = cpu->r + 9;
                            }
                            uVar20 = (ulong)*puVar6;
                            pcVar14 = 
                            "ASSERTION FAILED: r9 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                            ;
                            uVar21 = local_34;
                          }
                        }
                        else {
LAB_00102f8a:
                          alStack_60[uVar3 * -10 + 2] = 0x6c;
                          uVar2 = alStack_60[uVar3 * -10 + 2];
                          alStack_60[uVar3 * -10 + 2] = 0x102fac;
                          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                  ,uVar2);
                          puVar6 = cpu->highreg_fiq;
                          if (((cpu->cpsr).raw & 0x1f) != 0x11) {
                            puVar6 = cpu->r + 8;
                          }
                          uVar20 = (ulong)*puVar6;
                          pcVar14 = 
                          "ASSERTION FAILED: r8 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                          ;
                          uVar21 = local_34;
                        }
                      }
                      else {
                        if (uVar13 != cpu->r[8]) goto LAB_00102f8a;
                        uVar13 = piVar19[-7];
                        if (uVar13 != cpu->r[9]) goto LAB_00102c84;
                        uVar13 = piVar19[-6];
                        if (uVar13 != cpu->r[10]) goto LAB_00102d55;
                        uVar13 = piVar19[-5];
                        alStack_60[uVar3 * -10 + 2] = 0x68;
                        lVar12 = alStack_60[uVar3 * -10 + 2];
                        if (uVar13 == cpu->r[0xb]) goto LAB_001029f4;
LAB_00102e26:
                        alStack_60[uVar3 * -10 + 2] = 0x6f;
                        uVar2 = alStack_60[uVar3 * -10 + 2];
                        alStack_60[uVar3 * -10 + 2] = 0x102e48;
                        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                                ,uVar2);
                        puVar6 = cpu->highreg_fiq + 3;
                        if (((cpu->cpsr).raw & 0x1f) != 0x11) {
                          puVar6 = cpu->r + 0xb;
                        }
                        uVar20 = (ulong)*puVar6;
                        pcVar14 = 
                        "ASSERTION FAILED: r11 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                        ;
                        uVar21 = local_34;
                      }
                    }
                    else {
                      alStack_60[uVar3 * -10 + 2] = 0x6b;
                      uVar2 = alStack_60[uVar3 * -10 + 2];
                      alStack_60[uVar3 * -10 + 2] = 0x102edb;
                      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                              ,uVar2);
                      uVar20 = (ulong)cpu->r[7];
                      pcVar14 = 
                      "ASSERTION FAILED: r7 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                      ;
                      uVar21 = local_34;
                    }
                  }
                  else {
                    alStack_60[uVar3 * -10 + 2] = 0x6a;
                    uVar2 = alStack_60[uVar3 * -10 + 2];
                    alStack_60[uVar3 * -10 + 2] = 0x102e0a;
                    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                            ,uVar2);
                    uVar20 = (ulong)cpu->r[6];
                    pcVar14 = 
                    "ASSERTION FAILED: r6 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                    ;
                    uVar21 = local_34;
                  }
                }
                else {
                  alStack_60[uVar3 * -10 + 2] = 0x69;
                  uVar2 = alStack_60[uVar3 * -10 + 2];
                  alStack_60[uVar3 * -10 + 2] = 0x102d39;
                  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                          ,uVar2);
                  uVar20 = (ulong)cpu->r[5];
                  pcVar14 = 
                  "ASSERTION FAILED: r5 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m"
                  ;
                  uVar21 = local_34;
                }
              }
              else {
                alStack_60[uVar3 * -10 + 2] = 0x68;
                uVar2 = alStack_60[uVar3 * -10 + 2];
                alStack_60[uVar3 * -10 + 2] = 0x102c68;
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                        ,uVar2);
                uVar20 = (ulong)cpu->r[4];
                pcVar14 = 
                "ASSERTION FAILED: r4 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
                uVar21 = local_34;
              }
            }
            else {
              alStack_60[uVar3 * -10 + 2] = 0x67;
              uVar2 = alStack_60[uVar3 * -10 + 2];
              alStack_60[uVar3 * -10 + 2] = 0x102f6e;
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                      ,uVar2);
              uVar20 = (ulong)cpu->r[3];
              pcVar14 = 
              "ASSERTION FAILED: r3 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
              uVar21 = local_34;
            }
          }
          else {
            alStack_60[uVar3 * -10 + 2] = 0x66;
            uVar2 = alStack_60[uVar3 * -10 + 2];
            alStack_60[uVar3 * -10 + 2] = 0x102e9d;
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                    ,uVar2);
            uVar20 = (ulong)cpu->r[2];
            pcVar14 = 
            "ASSERTION FAILED: r2 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
            uVar21 = local_34;
          }
        }
        else {
          alStack_60[uVar3 * -10 + 2] = 0x65;
          uVar2 = alStack_60[uVar3 * -10 + 2];
          alStack_60[uVar3 * -10 + 2] = 0x102dcc;
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                  ,uVar2);
          uVar20 = (ulong)cpu->r[1];
          pcVar14 = 
          "ASSERTION FAILED: r1 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
          uVar21 = local_34;
        }
      }
      else {
        alStack_60[uVar3 * -10 + 2] = 100;
        uVar2 = alStack_60[uVar3 * -10 + 2];
        alStack_60[uVar3 * -10 + 2] = 0x102cfb;
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h"
                ,uVar2);
        uVar20 = (ulong)cpu->r[0];
        pcVar14 = 
        "ASSERTION FAILED: r0 expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
        uVar21 = local_34;
      }
LAB_00102be2:
      alStack_60[uVar3 * -10 + 2] = 0x102be9;
      fprintf(_stderr,pcVar14,(ulong)uVar13,uVar20,(ulong)uVar21);
      goto LAB_00102be9;
    }
    if ((int)local_38 < 0) {
      return 0;
    }
LAB_00102a9a:
    alStack_60[uVar3 * -10 + 2] = 0x102a9f;
    iVar5 = arm7tdmi_step(cpu);
    if (((long)uVar20 < lVar22) && (uVar13 = piVar19[-0x12], uVar13 != cpu->instr)) {
      alStack_60[uVar3 * -10 + 2] = 0x7e;
      uVar2 = alStack_60[uVar3 * -10 + 2];
      alStack_60[uVar3 * -10 + 2] = 0x103088;
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h",
              uVar2);
      uVar10 = cpu->instr;
      pcVar14 = 
      "ASSERTION FAILED: instruction expected: 0x%08X != actual: 0x%08X adjPC: 0x%08X\n\n\x1b[0;m";
LAB_001030a2:
      uVar20 = (ulong)uVar10;
      goto LAB_00102be2;
    }
    uVar20 = uVar20 + 1;
    piVar19 = piVar19 + 0x14;
  } while (((int)local_38 < 1) || (uVar21 != local_40));
  uVar21 = cpu->r[local_38];
  if (uVar21 == 0) {
    if (1 < gba_log_verbosity) {
      alStack_60[uVar3 * -10 + 2] = 0x102b10;
      printf("\x1b[0;36m[INFO]  Passed all tests!\n\x1b[0;m");
    }
    return 0;
  }
  alStack_60[uVar3 * -10 + 2] = 0x1030d0;
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/tests/test_common.h",0x85
         );
  alStack_60[uVar3 * -10 + 2] = 0x1030e3;
  fprintf(_stderr,"FAILED TEST: %d\n\x1b[0;m",(ulong)uVar21);
LAB_00102be9:
  alStack_60[uVar3 * -10 + 2] = 1;
  uVar2 = alStack_60[uVar3 * -10 + 2];
  alStack_60[uVar3 * -10 + 2] = 0x102bf1;
  exit((int)uVar2);
}

Assistant:

int test_loop(const char* rom_filename, int num_log_lines, const char* log_filename, word test_failed_address, int watch_reg) {
    log_set_verbosity(4);
    init_gbasystem(rom_filename, NULL, false);

    skip_bios(cpu);

    cpu_log_t lines[num_log_lines];

    load_log(log_filename, num_log_lines, lines);

    loginfo("ROM loaded: %lu bytes", mem->rom_size)
    loginfo("Beginning CPU loop")
    int step = 0;
    int cycles = 0;

    while(true) {
        word adjusted_pc = cpu->pc - (cpu->cpsr.thumb ? 2 : 4);
        if (step >= num_log_lines) {
            if (watch_reg < 0) {
                return 0; // We win!
            }
        } else {
            // Register values in the log are BEFORE EXECUTING the instruction on that line
            logdebug("Checking registers against step %d (line %d in log)", step, step + 1)
            ASSERT_EQUAL(adjusted_pc, "Address", lines[step].address, cpu->pc - (cpu->cpsr.thumb ? 2 : 4))

            if (lines[step].cpsr.raw != cpu->cpsr.raw) {
                printf("Expected cpsr: ");
                printcpsr(lines[step].cpsr);
                printf(" Actual cpsr: ");
                printcpsr(cpu->cpsr);
                printf("\n");
            }

            ASSERT_EQUAL(adjusted_pc, "r0", lines[step].r[0], get_register(cpu, 0))
            ASSERT_EQUAL(adjusted_pc, "r1", lines[step].r[1], get_register(cpu, 1))
            ASSERT_EQUAL(adjusted_pc, "r2", lines[step].r[2], get_register(cpu, 2))
            ASSERT_EQUAL(adjusted_pc, "r3", lines[step].r[3], get_register(cpu, 3))
            ASSERT_EQUAL(adjusted_pc, "r4", lines[step].r[4], get_register(cpu, 4))
            ASSERT_EQUAL(adjusted_pc, "r5", lines[step].r[5], get_register(cpu, 5))
            ASSERT_EQUAL(adjusted_pc, "r6", lines[step].r[6], get_register(cpu, 6))
            ASSERT_EQUAL(adjusted_pc, "r7", lines[step].r[7], get_register(cpu, 7))
            ASSERT_EQUAL(adjusted_pc, "r8", lines[step].r[8], get_register(cpu, 8))
            ASSERT_EQUAL(adjusted_pc, "r9", lines[step].r[9], get_register(cpu, 9))
            ASSERT_EQUAL(adjusted_pc, "r10", lines[step].r[10], get_register(cpu, 10))
            ASSERT_EQUAL(adjusted_pc, "r11", lines[step].r[11], get_register(cpu, 11))
            ASSERT_EQUAL(adjusted_pc, "r12", lines[step].r[12], get_register(cpu, 12))
            ASSERT_EQUAL(adjusted_pc, "r13 (SP)", lines[step].r[13], get_register(cpu, 13))
            ASSERT_EQUAL(adjusted_pc, "r14 (LR)", lines[step].r[14], get_register(cpu, 14))
            ASSERT_EQUAL(adjusted_pc, "r15 (PC)", lines[step].r[15], get_register(cpu, 15))
            ASSERT_EQUAL(adjusted_pc, "CPSR", lines[step].cpsr.raw, cpu->cpsr.raw)

            //ASSERT_EQUAL(adjusted_pc, "cycles", lines[step].cycles, cycles)
            if (cycles != lines[step].cycles) {
                logwarn("Cycles incorrect!")
            }
        }

        cycles = arm7tdmi_step(cpu);
        if (step < num_log_lines) {
            ASSERT_EQUAL(adjusted_pc, "instruction", lines[step].instruction, cpu->instr)
        }
        step++;

        if (adjusted_pc == test_failed_address && watch_reg > 0) {
            word failed_test = cpu->r[watch_reg];
            if (failed_test > 0) {
                logfatal("FAILED TEST: %d", failed_test)
            } else {
                loginfo("Passed all tests!")
                return 0;
            }
        }
    }
}